

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

int __thiscall
rr::MultiSampleLineRasterizer::init(MultiSampleLineRasterizer *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  float *in_RDX;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec4 p3;
  Vec4 p2;
  Vec4 p1;
  Vec4 p0;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  fVar3 = *in_RDX - *(float *)ctx;
  fVar4 = in_RDX[1] - *(float *)(ctx + 4);
  fVar5 = 1.0 / SQRT(fVar3 * fVar3 + fVar4 * fVar4 + 0.0);
  fVar2 = in_XMM0_Da * 0.5;
  fVar4 = fVar2 * fVar5 * -fVar4;
  fVar3 = fVar2 * fVar5 * fVar3;
  fVar5 = fVar2 * 0.0;
  fVar2 = fVar2 * 0.0;
  fStack_34 = *(float *)(ctx + 4) + fVar3;
  local_38 = *(float *)ctx + fVar4;
  fStack_30 = *(float *)(ctx + 8) + fVar5;
  fStack_2c = *(float *)(ctx + 0xc) + fVar2;
  fStack_44 = *(float *)(ctx + 4) - fVar3;
  local_48 = *(float *)ctx - fVar4;
  fStack_40 = *(float *)(ctx + 8) - fVar5;
  fStack_3c = *(float *)(ctx + 0xc) - fVar2;
  fStack_54 = in_RDX[1] - fVar3;
  local_58 = *in_RDX - fVar4;
  fStack_50 = in_RDX[2] - fVar5;
  fStack_4c = in_RDX[3] - fVar2;
  TriangleRasterizer::init(&this->m_triangleRasterizer0,(EVP_PKEY_CTX *)&local_38);
  iVar1 = TriangleRasterizer::init(&this->m_triangleRasterizer1,(EVP_PKEY_CTX *)&local_58);
  return iVar1;
}

Assistant:

void MultiSampleLineRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, float lineWidth)
{
	// allow creation of single sampled rasterizer objects but do not allow using them
	DE_ASSERT(m_numSamples > 1);

	const tcu::Vec2 lineVec		= tcu::Vec2(tcu::Vec4(v1).xy()) - tcu::Vec2(tcu::Vec4(v0).xy());
	const tcu::Vec2 normal2		= tcu::normalize(tcu::Vec2(-lineVec[1], lineVec[0]));
	const tcu::Vec4 normal4		= tcu::Vec4(normal2.x(), normal2.y(), 0, 0);
	const float offset			= lineWidth / 2.0f;

	const tcu::Vec4 p0 = v0 + normal4 * offset;
	const tcu::Vec4 p1 = v0 - normal4 * offset;
	const tcu::Vec4 p2 = v1 - normal4 * offset;
	const tcu::Vec4 p3 = v1 + normal4 * offset;

	// Edge 0 -> 1 is always along the line and edge 1 -> 2 is in 90 degree angle to the line
	m_triangleRasterizer0.init(p0, p3, p2);
	m_triangleRasterizer1.init(p2, p1, p0);
}